

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.cpp
# Opt level: O0

int main(void)

{
  allocator<unsigned_char> *this;
  size_type __n;
  uchar *puVar1;
  uchar *puVar2;
  uchar *src;
  uchar *puVar3;
  allocator<unsigned_char> local_279;
  undefined1 local_278 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  undefined1 local_258 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> text;
  size_t size;
  char local_218 [8];
  ifstream in;
  deflate_encoder local_9 [8];
  deflate_encoder enc;
  
  andyzip::deflate_encoder::deflate_encoder(local_9);
  std::ifstream::ifstream(local_218,"C:\\Users\\Andy\\gilgamesh\\examples\\data\\4GRG.pdb",_S_bin);
  std::istream::seekg((long)local_218,_S_beg);
  text.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)std::istream::tellg();
  __n = std::fpos::operator_cast_to_long
                  ((fpos *)&text.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
  this = (allocator<unsigned_char> *)
         ((long)&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_char>::allocator(this);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_258,__n,this);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::istream::seekg((long)local_218,_S_beg);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_258);
  std::istream::read(local_218,(long)puVar1);
  std::allocator<unsigned_char>::allocator(&local_279);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278,__n,&local_279);
  std::allocator<unsigned_char>::~allocator(&local_279);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278);
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278);
  src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_258);
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_258);
  andyzip::deflate_encoder::encode(local_9,puVar1,puVar2 + __n,src,puVar3 + (__n - 1));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_278);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_258);
  std::ifstream::~ifstream(local_218);
  return 0;
}

Assistant:

int main() {
  andyzip::deflate_encoder enc;

  //static const uint8_t text[] = "to be or not to be, that is the question! 1234 1234 1234";
  //static const uint8_t text[] = "123123123";

  std::ifstream in("C:\\Users\\Andy\\gilgamesh\\examples\\data\\4GRG.pdb", std::ios::binary);
  in.seekg(0, std::ios::end);
  size_t size = (size_t)in.tellg();
  std::vector<uint8_t> text(size);
  in.seekg(0, std::ios::beg);
  in.read((char*)text.data(), size);
  std::vector<uint8_t> buffer(size);
  enc.encode(buffer.data(), buffer.data() + size, text.data(), text.data() + size - 1);
}